

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

int gtStripSeparate(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  int iVar1;
  TIFF *tif;
  undefined1 auVar2 [16];
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  tmsize_t tVar8;
  char *module;
  int iVar9;
  undefined4 in_register_0000000c;
  ulong uVar10;
  char *fmt;
  int iVar11;
  uint uVar12;
  byte bVar13;
  ulong uVar14;
  uint32_t *puVar15;
  uint32_t uVar16;
  uint32_t *puVar17;
  int iVar18;
  uint uVar19;
  long size_to_read;
  bool bVar20;
  uchar *local_e0;
  uint32_t rowsperstrip;
  ulong local_c0;
  uchar *local_b8;
  uchar *local_b0;
  uchar *local_a8;
  uchar *buf;
  ulong local_98;
  uint local_8c;
  tmsize_t local_88;
  ulong local_80;
  ulong local_78;
  uint32_t *local_70;
  ulong local_68;
  long local_60;
  tmsize_t local_58;
  ulong local_50;
  anon_union_8_3_994a2fbf_for_put local_48;
  ulong local_40;
  ulong local_38;
  
  local_c0 = CONCAT44(in_register_0000000c,h);
  tif = img->tif;
  local_48 = img->put;
  buf = (uchar *)0x0;
  iVar1 = img->alpha;
  uVar12 = img->width;
  local_88 = TIFFStripSize(tif);
  local_58 = _TIFFMultiplySSize(tif,4 - (ulong)(iVar1 == 0),local_88,"gtStripSeparate");
  if (local_58 == 0) {
    return 0;
  }
  uVar5 = setorientation(img);
  local_68 = 0;
  if ((uVar5 & 1) != 0) {
    if ((int)w < 0) {
      module = TIFFFileName(tif);
      fmt = "Width overflow";
      goto LAB_002a4588;
    }
    local_68 = (ulong)(w * -2);
  }
  iVar9 = *(int *)&img->photometric;
  bVar20 = (ushort)iVar9 < 4;
  uVar19 = 3;
  if (bVar20) {
    uVar19 = (uint)(0x1000300010001 >> ((byte)(iVar9 << 4) & 0x3f));
  }
  local_70 = raster;
  TIFFGetFieldDefaulted(tif,0x116,&rowsperstrip);
  uVar7 = TIFFScanlineSize(tif);
  uVar3 = uVar12 - w;
  if (uVar12 < w) {
    uVar3 = 0;
  }
  local_50 = (ulong)uVar3;
  local_98 = uVar7;
  if ((int)local_c0 != 0) {
    bVar13 = bVar20 & 0xbU >> ((byte)iVar9 & 0xf);
    local_60 = local_88 * 3;
    local_80 = (ulong)w;
    local_e0 = (uchar *)0x0;
    local_8c = uVar19 & 0xffff;
    local_b0 = (uchar *)0x0;
    local_b8 = (uchar *)0x0;
    local_a8 = (uchar *)0x0;
    uVar14 = 0;
    local_78 = (ulong)w;
    while( true ) {
      puVar4 = buf;
      iVar11 = (int)uVar14;
      uVar16 = img->row_offset + iVar11;
      iVar9 = rowsperstrip - uVar16 % rowsperstrip;
      iVar18 = (uint)local_c0 - iVar11;
      if ((uint)(iVar9 + iVar11) <= (uint)local_c0) {
        iVar18 = iVar9;
      }
      uVar10 = (ulong)(uVar16 % rowsperstrip + iVar18);
      if ((0 < (long)uVar7) &&
         (auVar2._8_8_ = 0, auVar2._0_8_ = uVar7,
         SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0) < uVar10)) break;
      local_38 = uVar14;
      uVar6 = TIFFComputeStrip(tif,uVar16,0);
      size_to_read = uVar7 * uVar10;
      local_40 = uVar10;
      if (puVar4 == (uchar *)0x0) {
        tVar8 = _TIFFReadEncodedStripAndAllocBuffer(tif,uVar6,&buf,local_58,size_to_read);
        local_e0 = buf;
        if ((tVar8 != -1) || ((iVar9 = 0, buf != (uchar *)0x0 && (img->stoponerr == 0)))) {
          if (bVar13 != 0) {
            local_a8 = (uchar *)0x0;
            if (iVar1 != 0) {
              local_a8 = buf + local_60;
            }
            local_b0 = buf;
            local_b8 = buf;
            uVar7 = local_98;
            goto LAB_002a43a3;
          }
          local_b0 = buf + local_88;
          local_b8 = local_b0 + local_88;
          local_a8 = (uchar *)0x0;
          if (iVar1 != 0) {
            local_a8 = local_b8 + local_88;
          }
LAB_002a4337:
          uVar7 = local_98;
          uVar6 = TIFFComputeStrip(tif,uVar16,1);
          tVar8 = TIFFReadEncodedStrip(tif,uVar6,local_b0,size_to_read);
          if ((tVar8 != -1) || (img->stoponerr == 0)) {
            uVar6 = TIFFComputeStrip(tif,uVar16,2);
            tVar8 = TIFFReadEncodedStrip(tif,uVar6,local_b8,size_to_read);
            if ((tVar8 != -1) || (img->stoponerr == 0)) goto LAB_002a43a3;
          }
LAB_002a44ea:
          iVar9 = 0;
        }
        goto LAB_002a44ec;
      }
      tVar8 = TIFFReadEncodedStrip(tif,uVar6,local_e0,size_to_read);
      if ((tVar8 == -1) && (img->stoponerr != 0)) goto LAB_002a44ea;
      uVar7 = local_98;
      if (bVar13 == 0) goto LAB_002a4337;
LAB_002a43a3:
      if (iVar1 != 0) {
        uVar16 = TIFFComputeStrip(tif,uVar16,(uint16_t)local_8c);
        tVar8 = TIFFReadEncodedStrip(tif,uVar16,local_a8,local_40 * uVar7);
        if ((tVar8 == -1) && (img->stoponerr != 0)) goto LAB_002a44ea;
      }
      iVar9 = (int)local_38;
      (*local_48.any)(img);
      uVar12 = iVar9 + iVar18;
      uVar14 = (ulong)uVar12;
      if ((uint)local_c0 <= uVar12) goto code_r0x002a44b9;
    }
    module = TIFFFileName(tif);
    fmt = "Integer overflow in gtStripSeparate";
LAB_002a4588:
    TIFFErrorExtR(tif,module,fmt);
    return 0;
  }
  iVar9 = 1;
  goto LAB_002a455b;
code_r0x002a44b9:
  iVar9 = 1;
LAB_002a44ec:
  if (1 < uVar5) {
    uVar7 = 0;
    uVar14 = 0;
    do {
      puVar15 = local_70 + (uint)((int)uVar14 * (int)local_78) + (local_80 - 1);
      if (local_70 + (uint)((int)uVar14 * (int)local_78) < puVar15) {
        puVar17 = local_70 + uVar7 + 1;
        do {
          uVar16 = puVar17[-1];
          puVar17[-1] = *puVar15;
          *puVar15 = uVar16;
          puVar15 = puVar15 + -1;
          bVar20 = puVar17 < puVar15;
          puVar17 = puVar17 + 1;
        } while (bVar20);
      }
      uVar14 = uVar14 + 1;
      uVar7 = (ulong)(uint)((int)uVar7 + (int)local_78);
    } while (uVar14 != (local_c0 & 0xffffffff));
  }
LAB_002a455b:
  _TIFFfreeExt(img->tif,buf);
  return iVar9;
}

Assistant:

static int gtStripSeparate(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                           uint32_t h)
{
    TIFF *tif = img->tif;
    tileSeparateRoutine put = img->put.separate;
    unsigned char *buf = NULL;
    unsigned char *p0 = NULL, *p1 = NULL, *p2 = NULL, *pa = NULL;
    uint32_t row, y, nrow, rowstoread;
    tmsize_t pos;
    tmsize_t scanline;
    uint32_t rowsperstrip, offset_row;
    uint32_t imagewidth = img->width;
    tmsize_t stripsize;
    tmsize_t bufsize;
    int32_t fromskew, toskew;
    int alpha = img->alpha;
    int ret = 1, flip;
    uint16_t colorchannels;

    stripsize = TIFFStripSize(tif);
    bufsize =
        _TIFFMultiplySSize(tif, alpha ? 4 : 3, stripsize, "gtStripSeparate");
    if (bufsize == 0)
    {
        return (0);
    }

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if (w > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "Width overflow");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(w + w);
    }
    else
    {
        y = 0;
        toskew = -(int32_t)(w - w);
    }

    switch (img->photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            colorchannels = 1;
            break;

        default:
            colorchannels = 3;
            break;
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);
    scanline = TIFFScanlineSize(tif);
    fromskew = (w < imagewidth ? imagewidth - w : 0);
    for (row = 0; row < h; row += nrow)
    {
        uint32_t temp;
        rowstoread = rowsperstrip - (row + img->row_offset) % rowsperstrip;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        offset_row = row + img->row_offset;
        temp = (row + img->row_offset) % rowsperstrip + nrow;
        if (scanline > 0 && temp > (size_t)(TIFF_TMSIZE_T_MAX / scanline))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif),
                          "Integer overflow in gtStripSeparate");
            return 0;
        }
        if (buf == NULL)
        {
            if (_TIFFReadEncodedStripAndAllocBuffer(
                    tif, TIFFComputeStrip(tif, offset_row, 0), (void **)&buf,
                    bufsize, temp * scanline) == (tmsize_t)(-1) &&
                (buf == NULL || img->stoponerr))
            {
                ret = 0;
                break;
            }
            p0 = buf;
            if (colorchannels == 1)
            {
                p2 = p1 = p0;
                pa = (alpha ? (p0 + 3 * stripsize) : NULL);
            }
            else
            {
                p1 = p0 + stripsize;
                p2 = p1 + stripsize;
                pa = (alpha ? (p2 + stripsize) : NULL);
            }
        }
        else if (TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 0),
                                      p0, temp * scanline) == (tmsize_t)(-1) &&
                 img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (colorchannels > 1 &&
            TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 1), p1,
                                 temp * scanline) == (tmsize_t)(-1) &&
            img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (colorchannels > 1 &&
            TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 2), p2,
                                 temp * scanline) == (tmsize_t)(-1) &&
            img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (alpha)
        {
            if (TIFFReadEncodedStrip(
                    tif, TIFFComputeStrip(tif, offset_row, colorchannels), pa,
                    temp * scanline) == (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
        }

        pos = ((row + img->row_offset) % rowsperstrip) * scanline +
              ((tmsize_t)img->col_offset * img->samplesperpixel);
        tmsize_t roffset = (tmsize_t)y * w;
        (*put)(img, raster + roffset, 0, y, w, nrow, fromskew, toskew, p0 + pos,
               p1 + pos, p2 + pos, (alpha ? (pa + pos) : NULL));
        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}